

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vehicle.cpp
# Opt level: O2

void __thiscall Car::add_node(Car *this,Node *a,double **matrix)

{
  if ((this->tour).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      (this->tour).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    this->now_time =
         (int)matrix[this->now_idx][a->idx] / this->car_speed + this->now_time + a->unload_time;
  }
  std::vector<Node,_std::allocator<Node>_>::push_back(&this->tour,a);
  this->now_load = this->now_load + a->demand;
  this->now_idx = a->idx;
  a->visited = true;
  return;
}

Assistant:

void Car::add_node(Node *a, double** matrix)
{
	if(!tour.empty()){// though the tour first adds the depot, it doesnt count time 
		now_time += (int)matrix[now_idx][a->idx] / car_speed;
		now_time += a->unload_time;	
	}
	tour.push_back(*a);
	now_load += a->demand;
	now_idx = a->idx;
	a->visited = true;
}